

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O1

PSprite __thiscall DataSourceAmiga::get_map_object_sprite(DataSourceAmiga *this,size_t index)

{
  byte compression;
  byte bVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  byte bVar3;
  long lVar4;
  ushort uVar5;
  int iVar6;
  PSpriteAmiga *pPVar7;
  uint uVar8;
  PBuffer *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  byte filling;
  byte bVar10;
  byte bVar11;
  PBuffer PVar12;
  PSprite PVar13;
  PSpriteAmiga mask;
  PSpriteAmiga pixels;
  PBuffer data;
  undefined8 local_70;
  element_type *local_68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  element_type *local_58;
  PSpriteAmiga sprite;
  element_type *local_38;
  
  local_60._M_pi = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(index + 0x58);
  local_58 = *(element_type **)(index + 0x60);
  if (local_58 != (element_type *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&(local_58->super_enable_shared_from_this<Buffer>)._M_weak_this.
               super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(local_58->super_enable_shared_from_this<Buffer>)._M_weak_this.
                    super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
      UNLOCK();
    }
    else {
      *(int *)&(local_58->super_enable_shared_from_this<Buffer>)._M_weak_this.
               super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           *(int *)&(local_58->super_enable_shared_from_this<Buffer>)._M_weak_this.
                    super___weak_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1;
    }
  }
  PVar12 = get_data_from_catalog((DataSourceAmiga *)&data,index,6,in_RDX);
  _Var9 = PVar12.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (local_58 != (element_type *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
    _Var9._M_pi = extraout_RDX;
  }
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
    _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                  (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read;
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 2);
    uVar5 = *(ushort *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 2);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 4);
    if ((data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->endianess ==
        EndianessBig) {
      mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_
           = uVar5;
      lVar4 = 1;
      pPVar7 = &pixels;
      do {
        *(undefined1 *)
         &(pPVar7->super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>).
          _M_ptr = *(undefined1 *)
                    ((long)&mask.
                            super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr + lVar4);
        pPVar7 = (PSpriteAmiga *)
                 ((long)&(pPVar7->
                         super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr + 1);
        lVar4 = lVar4 + -1;
        uVar5 = (ushort)pixels.
                        super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr;
      } while (lVar4 == 0);
    }
    bVar3 = *(byte *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 4);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 5);
    compression = *(byte *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 5);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 6);
    bVar1 = *(byte *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 6);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 7);
    bVar10 = *(byte *)((long)&(_Var9._M_pi)->_vptr__Sp_counted_base + 7);
    (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->read =
         (uint8_t *)&(_Var9._M_pi)->_M_use_count;
    if (compression != 0) {
      if (bVar3 == 0) {
        bVar3 = (byte)(uVar5 / compression);
      }
      iVar6 = 1;
      bVar11 = 0;
      filling = 0;
      do {
        filling = filling >> 1;
        bVar11 = bVar11 >> 1;
        if ((char)bVar10 < '\0') {
          filling = filling | 0x10;
          bVar11 = bVar11 | bVar10 >> 2 & 0x10;
          bVar10 = bVar10 * '\x02';
        }
        bVar10 = bVar10 * '\x02';
        iVar6 = iVar6 + -1;
      } while (iVar6 == 0);
      local_70 = data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_68 = (element_type *)
                 data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
          _M_use_count = (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi)->_M_use_count + 1;
        }
      }
      decode_mask_sprite((DataSourceAmiga *)&mask,
                         (PBuffer *)
                         data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (size_t)&local_70,(ulong)((uint)bVar3 * 8));
      if (local_68 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_68);
      }
      Buffer::pop_tail((Buffer *)&stack0xffffffffffffffc0);
      decode_planned_sprite
                ((DataSourceAmiga *)&pixels,(PBuffer *)(ulong)bVar11,
                 (size_t)&stack0xffffffffffffffc0,(ulong)bVar3,compression,filling,
                 (uint8_t *)(ulong)bVar11,false);
      if (local_38 != (element_type *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_38);
      }
      _Var9._M_pi = mask.
                    super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      if (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi)->_M_use_count =
               (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi)->_M_use_count + 1;
        }
      }
      SpriteAmiga::get_amiga_masked
                ((SpriteAmiga *)&sprite,
                 (PSprite *)
                 CONCAT62(pixels.
                          super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                          ._M_ptr._2_6_,
                          (ushort)pixels.
                                  super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr));
      if (_Var9._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var9._M_pi);
      }
      _Var2._M_pi = sprite.
                    super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).delta_x = 1;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).delta_y = 0;
      iVar6 = (uint)bVar3 * -4;
      if (((ulong)in_RDX & 0xfffffffffffffff0) == 0x80) {
        iVar6 = 0;
      }
      uVar8 = -(uint)bVar1;
      _Var9._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(ulong)uVar8;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).offset_x = iVar6;
      ((sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
      ->super_SpriteBase).offset_y = uVar8;
      (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source =
           (_func_int **)
           sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
      (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
      sprite.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p =
           (pointer)_Var2._M_pi;
      if (pixels.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (pixels.
                   super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
        _Var9._M_pi = extraout_RDX_00;
      }
      if (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (mask.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
        _Var9._M_pi = extraout_RDX_01;
      }
      goto LAB_001342be;
    }
  }
  (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source = (_func_int **)0x0;
  (this->super_DataSourceLegacy).super_DataSourceBase.path._M_dataplus._M_p = (pointer)0x0;
LAB_001342be:
  if (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (data.super___shared_ptr<Buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    _Var9._M_pi = extraout_RDX_02;
  }
  PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (PSprite)PVar13.super___shared_ptr<Data::Sprite,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Data::PSprite
DataSourceAmiga::get_map_object_sprite(size_t index) {
  PBuffer data = get_data_from_catalog(6, index, gfxchip);
  if (!data) {
    return nullptr;
  }

  data->pop<uint16_t>();  // drop shadow_offset
  uint16_t bitplane_size = data->pop<uint16_t>();
  uint8_t width = data->pop<uint8_t>();
  uint8_t height = data->pop<uint8_t>();
  uint8_t offset_y = data->pop<uint8_t>();
  uint8_t compression = data->pop<uint8_t>();

  if (height == 0) {
    return nullptr;
  }
  if (width == 0) {
    width = bitplane_size / height;
  }

  uint8_t compressed = 0;
  uint8_t filled = 0;
  for (int i = 0 ; i < 2 ; i++) {
    compressed  = compressed >> 1;
    filled = filled >> 1;

    if (compression & 0x80) {
      compressed = compressed | 0x10;
      if (compression & 0x40) {
        filled = filled | 0x10;
      }
      compression = compression << 1;
    }
    compression = compression << 1;
  }

  PSpriteAmiga mask = decode_mask_sprite(data, width * 8, height);
  PSpriteAmiga pixels = decode_planned_sprite(data->pop_tail(), width, height,
                                              compressed, filled, palette);

  PSpriteAmiga sprite = pixels->get_amiga_masked(mask);
  sprite->set_delta(1, 0);
  if ((index >= 128) && (index <= 143)) {
    sprite->set_offset(0, -offset_y);
  } else {
    sprite->set_offset(-width * 4, -offset_y);
  }

  return sprite;
}